

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_ld_vec_arm(TCGContext_conflict *tcg_ctx,TCGv_vec r,TCGv_ptr b,TCGArg o)

{
  vec_gen_ldst(tcg_ctx,INDEX_op_ld_vec,r,b,o);
  return;
}

Assistant:

void tcg_gen_ld_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_ptr b, TCGArg o)
{
    vec_gen_ldst(tcg_ctx, INDEX_op_ld_vec, r, b, o);
}